

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
 nonsugar::detail::
 copy_shared<nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>
           (option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
            *t)

{
  shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
  sVar1;
  option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
  *t_local;
  
  sVar1 = std::
          make_shared<nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>const&>
                    (t);
  sVar1.
  super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = t;
  return (shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
          )sVar1.
           super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<T> copy_shared(T const &t)
{
    return std::make_shared<T>(t);
}